

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::AddJarManifest
          (GeneratorContextImpl *this)

{
  mapped_type *ppbVar1;
  mapped_type this_00;
  allocator<char> local_31;
  key_type local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"META-INF/MANIFEST.MF",&local_31);
  ppbVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->files_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*ppbVar1 == (mapped_type)0x0) {
    this_00 = (mapped_type)operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Manifest-Version: 1.0\nCreated-By: 1.6.0 (protoc)\n\n",
               (allocator<char> *)&local_30);
    *ppbVar1 = this_00;
  }
  return;
}

Assistant:

void CommandLineInterface::GeneratorContextImpl::AddJarManifest() {
  string** map_slot = &files_["META-INF/MANIFEST.MF"];
  if (*map_slot == NULL) {
    *map_slot = new string(
        "Manifest-Version: 1.0\n"
        "Created-By: 1.6.0 (protoc)\n"
        "\n");
  }
}